

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigSudokuVisualizer.cpp
# Opt level: O2

string * __thiscall
BigSudokuVisualizer::createCells_abi_cxx11_
          (string *__return_storage_ptr__,BigSudokuVisualizer *this,SudokuGitter *gitter1,
          SudokuGitter *gitter2)

{
  uint uVar1;
  cell cVar2;
  uint row;
  uint uVar3;
  uint col;
  uint uVar4;
  uint __val;
  uint col_1;
  uint uVar5;
  string colspan;
  uint local_a0;
  string local_90;
  ulong local_70;
  SudokuGitter *local_68;
  uint local_5c;
  ulong local_58;
  allocator local_50 [32];
  
  uVar1 = gitter1->elements;
  uVar3 = gitter1->quadWidth;
  local_58 = (ulong)(uVar1 - gitter1->quadHeight);
  local_68 = gitter1;
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",local_50);
  std::__cxx11::string::string((string *)local_50,"",(allocator *)&local_90);
  std::__cxx11::string::append((char *)local_50);
  std::__cxx11::to_string(&local_90,uVar1 - uVar3);
  std::__cxx11::string::append((string *)local_50);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::append((char *)local_50);
  local_a0 = 0;
  for (uVar3 = 0; uVar3 != (uint)local_58; uVar3 = uVar3 + 1) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    uVar4 = 0;
    while( true ) {
      uVar5 = local_a0 + uVar4;
      if (uVar1 == uVar4) break;
      cVar2 = SudokuGitter::getCell(local_68,uVar3,uVar4);
      if (cVar2.value == 0) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        std::__cxx11::to_string(&local_90,uVar5);
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&local_90);
      }
      else {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        std::__cxx11::to_string(&local_90,uVar5);
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        std::__cxx11::to_string(&local_90,cVar2.value);
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&local_90);
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      uVar4 = uVar4 + 1;
    }
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    local_a0 = uVar5;
  }
  uVar3 = 0;
  for (local_70 = 0; (uint)local_70 < local_68->quadHeight; local_70 = (ulong)((int)local_70 + 1)) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    local_5c = (int)local_58 + (int)local_70;
    for (uVar4 = 0; uVar5 = local_a0 + uVar4, uVar1 != uVar4; uVar4 = uVar4 + 1) {
      cVar2 = SudokuGitter::getCell(local_68,local_5c,uVar4);
      if (cVar2.value == 0) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        std::__cxx11::to_string(&local_90,uVar5);
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&local_90);
      }
      else {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        std::__cxx11::to_string(&local_90,uVar5);
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        std::__cxx11::to_string(&local_90,cVar2.value);
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&local_90);
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    uVar4 = gitter2->quadWidth;
    uVar3 = uVar3 + uVar4;
    for (uVar4 = uVar4 - (uVar4 == uVar1); uVar4 < uVar1; uVar4 = uVar4 + 1) {
      cVar2 = SudokuGitter::getCell(gitter2,(uint)local_70,uVar4);
      if (cVar2.value == 0) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        std::__cxx11::to_string(&local_90,uVar3);
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&local_90);
      }
      else {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        std::__cxx11::to_string(&local_90,uVar3);
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        std::__cxx11::to_string(&local_90,cVar2.value);
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&local_90);
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      uVar3 = uVar3 + 1;
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    local_a0 = uVar5;
  }
  for (uVar4 = gitter2->quadHeight; uVar4 < uVar1; uVar4 = uVar4 + 1) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    for (uVar5 = 0; __val = uVar3 + uVar5, uVar1 != uVar5; uVar5 = uVar5 + 1) {
      cVar2 = SudokuGitter::getCell(gitter2,uVar4,uVar5);
      if (cVar2.value == 0) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        std::__cxx11::to_string(&local_90,__val);
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&local_90);
      }
      else {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        std::__cxx11::to_string(&local_90,__val);
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        std::__cxx11::to_string(&local_90,cVar2.value);
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&local_90);
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    uVar3 = __val;
  }
  std::__cxx11::string::~string((string *)local_50);
  return __return_storage_ptr__;
}

Assistant:

const std::string BigSudokuVisualizer::createCells(SudokuGitter gitter1, SudokuGitter gitter2) {
    unsigned int size = gitter1.getElements();
    unsigned int colspan_size = size - gitter1.getQuadWidth();
    unsigned int rowspan_size = size - gitter1.getQuadHeight();

    std::string cells = "";
    std::string colspan = "";
    colspan.append("<td style='border: none' colspan='");
    colspan.append(std::to_string(colspan_size));
    colspan.append("'></td>");

    unsigned int counter = 0;
    unsigned int counter2 = 0;
    for (unsigned int row = 0; row < rowspan_size; row++) {
        cells.append("<tr>");
        for (unsigned int col = 0; col < size; col++) {
            unsigned int num = gitter1.getCell(row, col).value;
            if (num > 0) {
                cells.append("<td><input id='bigCell-");
                cells.append(std::to_string(counter));
                cells.append("' type='text' value='");
                cells.append(std::to_string(num));
                cells.append("' disabled></td>");
            } else {
                cells.append("<td><input id='bigCell-");
                cells.append(std::to_string(counter));
                cells.append("' type='text'></td>");
            }
            counter++;
        }
        cells.append(colspan);
        cells.append("</tr>");
    }

    for(unsigned int times = 0; times < gitter1.getQuadHeight(); times++){
        cells.append("<tr>");
        for (unsigned int col = 0; col < size; col++) {
            unsigned int num = gitter1.getCell(times + rowspan_size, col).value;
            if (num > 0) {
                cells.append("<td><input id='bigCell-");
                cells.append(std::to_string(counter));
                cells.append("' type='text' value='");
                cells.append(std::to_string(num));
                cells.append("' disabled></td>");
            } else {
                cells.append("<td><input id='bigCell-");
                cells.append(std::to_string(counter));
                cells.append("' type='text'></td>");
            }
            counter++;
        }
        counter2 += gitter2.getQuadWidth();
        unsigned int col = gitter2.getQuadWidth();
        if(col == size){
            col--;
        }
        for (col; col < size; col++) {
            unsigned int num = gitter2.getCell(times, col).value;
            if (num > 0) {
                cells.append("<td><input id='bigCell-");
                cells.append(std::to_string(counter2));
                cells.append("' type='text' value='");
                cells.append(std::to_string(num));
                cells.append("' disabled></td>");
            } else {
                cells.append("<td><input id='bigCell-");
                cells.append(std::to_string(counter2));
                cells.append("' type='text'></td>");
            }
            counter2++;
        }
        cells.append("</tr>");
    }
    for (unsigned int row = gitter2.getQuadHeight(); row < size; row++) {
        cells.append("<tr>");
        cells.append(colspan);
        for (unsigned int col = 0; col < size; col++) {
            unsigned int num = gitter2.getCell(row, col).value;
            if (num > 0) {
                cells.append("<td><input id='bigCell-");
                cells.append(std::to_string(counter2));
                cells.append("' type='text' value='");
                cells.append(std::to_string(num));
                cells.append("' disabled></td>");
            } else {
                cells.append("<td><input id='bigCell-");
                cells.append(std::to_string(counter2));
                cells.append("' type='text'></td>");
            }
            counter2++;
        }
        cells.append("</tr>");
    }
    return cells;
}